

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void NULLC::ClearMemory(void)

{
  long lVar1;
  
  collectionEnabled = 1;
  usedMemory = 0;
  ObjectBlockPool<8,_8192>::Reset((ObjectBlockPool<8,_8192> *)pool8);
  ObjectBlockPool<16,_4096>::Reset((ObjectBlockPool<16,_4096> *)pool16);
  ObjectBlockPool<32,_2048>::Reset((ObjectBlockPool<32,_2048> *)pool32);
  ObjectBlockPool<64,_1024>::Reset((ObjectBlockPool<64,_1024> *)pool64);
  ObjectBlockPool<128,_512>::Reset((ObjectBlockPool<128,_512> *)pool128);
  ObjectBlockPool<256,_256>::Reset((ObjectBlockPool<256,_256> *)pool256);
  ObjectBlockPool<512,_128>::Reset((ObjectBlockPool<512,_128> *)pool512);
  if (bigBlocks._24_8_ != 0) {
    Tree<NULLC::Range>::for_each
              ((Tree<NULLC::Range> *)bigBlocks,(node_type *)bigBlocks._24_8_,ClearBlock);
  }
  bigBlocks._0_8_ = 0;
  bigBlocks._16_4_ = 0x400;
  while (bigBlocks._8_8_ != 0) {
    lVar1 = *(long *)(bigBlocks._8_8_ + 0xa000);
    (*(code *)dealloc)();
    bigBlocks._8_8_ = lVar1;
  }
  bigBlocks._24_8_ = 0;
  DAT_00243efc = 0;
  DAT_00243f0c = 0;
  DAT_002438c4 = 0;
  return;
}

Assistant:

void NULLC::ClearMemory()
{
	collectionEnabled = true;

	usedMemory = 0;

	pool8.Reset();
	pool16.Reset();
	pool32.Reset();
	pool64.Reset();
	pool128.Reset();
	pool256.Reset();
	pool512.Reset();

	bigBlocks.for_each(ClearBlock);
	bigBlocks.clear();

	blocksToFinalize.clear();
	blocksToFree.clear();

	finalizeList.clear();
}